

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O3

void __thiscall
despot::POMDPXState::POMDPXState(POMDPXState *this,vector<int,_std::allocator<int>_> *aIndex)

{
  State::State(&this->super_State);
  (this->super_State)._vptr_State = (_func_int **)&PTR__POMDPXState_0018fb40;
  (this->vec_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vec_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->vec_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::operator=(&this->vec_id,aIndex);
  return;
}

Assistant:

POMDPXState::POMDPXState(vector<int> aIndex) {
	vec_id = aIndex;
}